

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O0

void __thiscall
Centaurus::NFABase<Centaurus::DFAState<char>_>::print
          (NFABase<Centaurus::DFAState<char>_> *this,wostream *os,wstring *graph_name)

{
  wostream *pwVar1;
  size_type sVar2;
  const_reference pvVar3;
  uint local_28;
  uint local_24;
  uint i_1;
  uint i;
  wstring *graph_name_local;
  wostream *os_local;
  NFABase<Centaurus::DFAState<char>_> *this_local;
  
  pwVar1 = std::operator<<(os,L"digraph ");
  pwVar1 = std::operator<<(pwVar1,(wstring *)graph_name);
  pwVar1 = std::operator<<(pwVar1,L" {");
  std::wostream::operator<<(pwVar1,std::endl<wchar_t,std::char_traits<wchar_t>>);
  pwVar1 = std::operator<<(os,L"rankdir=\"LR\";");
  std::wostream::operator<<(pwVar1,std::endl<wchar_t,std::char_traits<wchar_t>>);
  pwVar1 = std::operator<<(os,L"graph [ charset=\"UTF-8\", style=\"filled\" ];");
  std::wostream::operator<<(pwVar1,std::endl<wchar_t,std::char_traits<wchar_t>>);
  pwVar1 = std::operator<<(os,L"node [ style=\"solid,filled\" ];");
  std::wostream::operator<<(pwVar1,std::endl<wchar_t,std::char_traits<wchar_t>>);
  pwVar1 = std::operator<<(os,L"edge [ style=\"solid\" ];");
  std::wostream::operator<<(pwVar1,std::endl<wchar_t,std::char_traits<wchar_t>>);
  local_24 = 0;
  while( true ) {
    sVar2 = std::vector<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>::
            size(&this->m_states);
    if (sVar2 <= local_24) break;
    pwVar1 = std::operator<<(os,L"S");
    pwVar1 = (wostream *)std::wostream::operator<<(pwVar1,local_24);
    std::operator<<(pwVar1,L" [ label=\"");
    (*this->_vptr_NFABase[2])(this,os,(ulong)local_24);
    pwVar1 = std::operator<<(os,L"\", shape=circle ];");
    std::wostream::operator<<(pwVar1,std::endl<wchar_t,std::char_traits<wchar_t>>);
    local_24 = local_24 + 1;
  }
  local_28 = 0;
  while( true ) {
    sVar2 = std::vector<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>::
            size(&this->m_states);
    if (sVar2 <= local_28) break;
    pvVar3 = std::vector<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>::
             operator[](&this->m_states,(ulong)local_28);
    (*(pvVar3->super_NFABaseState<char,_Centaurus::IndexVector>)._vptr_NFABaseState[2])
              (pvVar3,os,(ulong)local_28);
    local_28 = local_28 + 1;
  }
  pwVar1 = std::operator<<(os,L"}");
  std::wostream::operator<<(pwVar1,std::endl<wchar_t,std::char_traits<wchar_t>>);
  return;
}

Assistant:

virtual void print(std::wostream& os, const std::wstring& graph_name) const
	{
		os << L"digraph " << graph_name << L" {" << std::endl;
		os << L"rankdir=\"LR\";" << std::endl;
		os << L"graph [ charset=\"UTF-8\", style=\"filled\" ];" << std::endl;
		os << L"node [ style=\"solid,filled\" ];" << std::endl;
		os << L"edge [ style=\"solid\" ];" << std::endl;

		for (unsigned int i = 0; i < m_states.size(); i++)
		{
			os << L"S" << i << L" [ label=\"";
			print_state(os, i);
			os << L"\", shape=circle ];" << std::endl;
		}

		for (unsigned int i = 0; i < m_states.size(); i++)
		{
			m_states[i].print(os, i);
		}

		os << L"}" << std::endl;
	}